

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O3

void __thiscall OpenMD::InteractionManager::InteractionManager(InteractionManager *this)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Electrostatic *pEVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 local_39;
  Electrostatic *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  this->_vptr_InteractionManager = (_func_int **)&PTR__InteractionManager_002fe250;
  p_Var1 = &(this->typeMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->info_,0,0xb8);
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->initialized_ = false;
  (this->typeMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->interactions_).
  super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interactions_).
  super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->interactions_).
  super__Vector_base<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->iHash_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->iHash_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->iHash_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sHash_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sHash_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sHash_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::LJ,std::allocator<OpenMD::LJ>>
            (&_Stack_30,(LJ **)&local_38,(allocator<OpenMD::LJ> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->lj_).super___shared_ptr<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->lj_).super___shared_ptr<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->lj_).super___shared_ptr<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::GB,std::allocator<OpenMD::GB>>
            (&_Stack_30,(GB **)&local_38,(allocator<OpenMD::GB> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->gb_).super___shared_ptr<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->gb_).super___shared_ptr<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->gb_).super___shared_ptr<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::Sticky,std::allocator<OpenMD::Sticky>>
            (&_Stack_30,(Sticky **)&local_38,(allocator<OpenMD::Sticky> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->sticky_).super___shared_ptr<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sticky_).super___shared_ptr<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->sticky_).super___shared_ptr<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::Morse,std::allocator<OpenMD::Morse>>
            (&_Stack_30,(Morse **)&local_38,(allocator<OpenMD::Morse> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->morse_).super___shared_ptr<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->morse_).super___shared_ptr<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->morse_).super___shared_ptr<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::RepulsivePower,std::allocator<OpenMD::RepulsivePower>>
            (&_Stack_30,(RepulsivePower **)&local_38,(allocator<OpenMD::RepulsivePower> *)&local_39)
  ;
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->repulsivePower_).
           super___shared_ptr<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->repulsivePower_).super___shared_ptr<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pEVar3;
  (this->repulsivePower_).super___shared_ptr<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::Mie,std::allocator<OpenMD::Mie>>
            (&_Stack_30,(Mie **)&local_38,(allocator<OpenMD::Mie> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->mie_).super___shared_ptr<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->mie_).super___shared_ptr<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->mie_).super___shared_ptr<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::EAM,std::allocator<OpenMD::EAM>>
            (&_Stack_30,(EAM **)&local_38,(allocator<OpenMD::EAM> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->eam_).super___shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->eam_).super___shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->eam_).super___shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SC,std::allocator<OpenMD::SC>>
            (&_Stack_30,(SC **)&local_38,(allocator<OpenMD::SC> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->sc_).super___shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->sc_).super___shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->sc_).super___shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::Electrostatic,std::allocator<OpenMD::Electrostatic>>
            (&_Stack_30,&local_38,(allocator<OpenMD::Electrostatic> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->electrostatic_).
           super___shared_ptr<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->electrostatic_).super___shared_ptr<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pEVar3;
  (this->electrostatic_).super___shared_ptr<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::MAW,std::allocator<OpenMD::MAW>>
            (&_Stack_30,(MAW **)&local_38,(allocator<OpenMD::MAW> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->maw_).super___shared_ptr<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->maw_).super___shared_ptr<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->maw_).super___shared_ptr<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  local_38 = (Electrostatic *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::InversePowerSeries,std::allocator<OpenMD::InversePowerSeries>>
            (&_Stack_30,(InversePowerSeries **)&local_38,
             (allocator<OpenMD::InversePowerSeries> *)&local_39);
  _Var4._M_pi = _Stack_30._M_pi;
  pEVar3 = local_38;
  local_38 = (Electrostatic *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->inversePowerSeries_).
           super___shared_ptr<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->inversePowerSeries_).
  super___shared_ptr<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar3;
  (this->inversePowerSeries_).
  super___shared_ptr<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  return;
}

Assistant:

InteractionManager::InteractionManager() {
    initialized_ = false;

    lj_                 = std::make_shared<LJ>();
    gb_                 = std::make_shared<GB>();
    sticky_             = std::make_shared<Sticky>();
    morse_              = std::make_shared<Morse>();
    repulsivePower_     = std::make_shared<RepulsivePower>();
    mie_                = std::make_shared<Mie>();
    eam_                = std::make_shared<EAM>();
    sc_                 = std::make_shared<SC>();
    electrostatic_      = std::make_shared<Electrostatic>();
    maw_                = std::make_shared<MAW>();
    inversePowerSeries_ = std::make_shared<InversePowerSeries>();
  }